

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O1

FFsOptions * __thiscall
level_info_t::GetOptData<FFsOptions>(level_info_t *this,FName *id,bool create)

{
  int iVar1;
  FOptionalMapinfoData *pFVar2;
  Node *pNVar3;
  Node *pNVar4;
  FName local_1c;
  
  pNVar3 = (this->optdata).Nodes + ((this->optdata).Size - 1 & id->Index);
  while ((pNVar4 = pNVar3, pNVar4 != (Node *)0x0 && (pNVar4->Next != (Node *)0x1))) {
    pNVar3 = pNVar4->Next;
    if ((pNVar4->Pair).Key.Index == id->Index) {
LAB_00510482:
      if (pNVar4 == (Node *)0x0) {
        if (create) {
          pFVar2 = (FOptionalMapinfoData *)operator_new(0x18);
          (pFVar2->identifier).Index = 0;
          pFVar2->Next = (FOptionalMapinfoData *)0x0;
          pFVar2->_vptr_FOptionalMapinfoData = (_func_int **)&PTR__FOptionalMapinfoData_0070ec70;
          iVar1 = FName::NameManager::FindName(&FName::NameData,"fragglescript",false);
          (pFVar2->identifier).Index = iVar1;
          pFVar2->field_0x14 = 0;
          local_1c = (FName)id->Index;
          pNVar3 = TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
                   ::GetNode(&this->optdata,&local_1c);
          (pNVar3->Pair).Value.Ptr = pFVar2;
        }
        else {
          pFVar2 = (FOptionalMapinfoData *)0x0;
        }
      }
      else {
        pFVar2 = (pNVar4->Pair).Value.Ptr;
      }
      return (FFsOptions *)pFVar2;
    }
  }
  pNVar4 = (Node *)0x0;
  goto LAB_00510482;
}

Assistant:

T *GetOptData(FName id, bool create = true)
	{
		FOptionalMapinfoDataPtr *pdat = optdata.CheckKey(id);
		
		if (pdat != NULL)
		{
			return static_cast<T*>(pdat->Ptr);
		}
		else if (create)
		{
			T *newobj = new T;
			optdata[id].Ptr = newobj;
			return newobj;
		}
		else return NULL;
	}